

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLCopy.cpp
# Opt level: O2

void __thiscall XPMP2::CSLObj::SetCopyResult(CSLObj *this,bool bResult)

{
  undefined7 in_register_00000031;
  string local_58;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,bResult) == 0) {
    if (glob < 4) {
      StripXPSysDir(&local_58,&this->path);
      StripXPSysDir(&local_38,&this->pathOrig);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
             ,0xc3,"SetCopyResult",logERR,"Copying to \'%s\' failed, falling back to \'%s\'",
             local_58._M_dataplus._M_p,local_38._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      if (glob < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
               ,0xc4,"SetCopyResult",logERR,"%s",gErrTxt_abi_cxx11_,local_38._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::operator=((string *)&this->path,(string *)&this->pathOrig);
    this->xpObjState = OLS_UNAVAIL;
  }
  else {
    if (glob < 2) {
      StripXPSysDir(&local_58,&this->path);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
             ,0xbf,"SetCopyResult",logINFO,"Created model copy \'%s\' successfully",
             local_58._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_58);
    }
    (this->pathOrig)._M_string_length = 0;
    *(this->pathOrig)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void CSLObj::SetCopyResult (bool bResult)
{
    if (bResult) {                      // success
        LOG_MSG(logINFO, INFO_CPY_SUCCEED, StripXPSysDir(path).c_str());
        pathOrig.clear();               // need no copy any longer
    } else {
        // Copying failed!
        LOG_MSG(logERR, ERR_CPY_FAILED, StripXPSysDir(path).c_str(), StripXPSysDir(pathOrig).c_str());
        LOG_MSG(logERR, "%s", gErrTxt.c_str());
        path = std::move(pathOrig);     // fall back to original
        xpObjState = OLS_UNAVAIL;
    }
}